

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleInsert(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **__ptr;
  ulong __size;
  int iVar1;
  
  iVar1 = p->nItems;
  __ptr = p->pTree;
  if (iVar1 == p->nItemsAlloc) {
    p->nItemsAlloc = iVar1 * 2;
    __size = (long)iVar1 << 4 | 8;
    if (__ptr == (Fxu_Double **)0x0) {
      __ptr = (Fxu_Double **)malloc(__size);
    }
    else {
      __ptr = (Fxu_Double **)realloc(__ptr,__size);
      iVar1 = p->nItems;
    }
    p->pTree = __ptr;
  }
  p->nItems = iVar1 + 1;
  __ptr[(long)iVar1 + 1] = pDiv;
  pDiv->HNum = iVar1 + 1;
  Fxu_HeapDoubleMoveUp(p,pDiv);
  return;
}

Assistant:

void Fxu_HeapDoubleInsert( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
	if ( p->nItems == p->nItemsAlloc )
		Fxu_HeapDoubleResize( p );
	// put the last entry to the last place and move up
	p->pTree[++p->nItems] = pDiv;
	pDiv->HNum = p->nItems;
	// move the last entry up if necessary
	Fxu_HeapDoubleMoveUp( p, pDiv );
}